

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::~QPlainTextEdit(QPlainTextEdit *this)

{
  bool bVar1;
  QPlainTextEditPrivate *this_00;
  QPlainTextDocumentLayoutPrivate *pQVar2;
  undefined8 *in_RDI;
  QPlainTextEditPrivate *d;
  
  *in_RDI = &PTR_metaObject_00d1d3a8;
  in_RDI[2] = &PTR__QPlainTextEdit_00d1d5a8;
  this_00 = d_func((QPlainTextEdit *)0x6c3e5a);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QPlainTextDocumentLayout> *)0x6c3e70);
  if (bVar1) {
    QPointer<QPlainTextDocumentLayout>::operator->((QPointer<QPlainTextDocumentLayout> *)0x6c3e87);
    pQVar2 = QPlainTextDocumentLayout::priv((QPlainTextDocumentLayout *)this_00);
    if (pQVar2->mainViewPrivate == this_00) {
      QPointer<QPlainTextDocumentLayout>::operator->((QPointer<QPlainTextDocumentLayout> *)0x6c3eae)
      ;
      pQVar2 = QPlainTextDocumentLayout::priv((QPlainTextDocumentLayout *)this_00);
      pQVar2->mainViewPrivate = (QPlainTextEditPrivate *)0x0;
    }
  }
  QAbstractScrollArea::~QAbstractScrollArea((QAbstractScrollArea *)this_00);
  return;
}

Assistant:

QPlainTextEdit::~QPlainTextEdit()
{
    Q_D(QPlainTextEdit);
    if (d->documentLayoutPtr) {
        if (d->documentLayoutPtr->priv()->mainViewPrivate == d)
            d->documentLayoutPtr->priv()->mainViewPrivate = nullptr;
    }
}